

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::ICUTranscoder::canTranscodeTo(ICUTranscoder *this,uint toCheck)

{
  undefined8 local_98;
  UConverterFromUCallback orgAction;
  UErrorCode *pUStack_88;
  bool res;
  UChar *startSrc;
  char *startTarget;
  char tmpBuf [64];
  undefined1 local_30 [8];
  void *orgContent;
  UConverterFromUCallback oldCB;
  UErrorCode err;
  uint srcCount;
  UChar srcBuf [2];
  uint toCheck_local;
  ICUTranscoder *this_local;
  
  oldCB._4_4_ = 1;
  err._0_2_ = (undefined2)toCheck;
  if ((toCheck & 0xffff0000) != 0) {
    err._2_2_ = ((undefined2)err & 0x3ff) + 0xdc00;
    oldCB._4_4_ = 2;
    err._0_2_ = (short)(toCheck >> 10) + 0xd800;
  }
  oldCB._0_4_ = 0;
  orgContent = (void *)0x0;
  srcCount = toCheck;
  _srcBuf = this;
  ucnv_setFromUCallBack_70
            (this->fConverter,UCNV_FROM_U_CALLBACK_STOP_70,0,&orgContent,local_30,&oldCB);
  startSrc = (UChar *)&startTarget;
  pUStack_88 = &err;
  oldCB._0_4_ = 0;
  ucnv_fromUnicode_70(this->fConverter,&startSrc,tmpBuf + 0x38,&stack0xffffffffffffff78,
                      (long)&err + (ulong)oldCB._4_4_ * 2,0,0,&oldCB);
  orgAction._7_1_ = (int)oldCB == 0;
  oldCB._0_4_ = 0;
  local_98 = 0;
  ucnv_setFromUCallBack_70(this->fConverter,orgContent,0,&local_98,local_30,&oldCB);
  return (bool)(orgAction._7_1_ & 1);
}

Assistant:

bool ICUTranscoder::canTranscodeTo(const unsigned int toCheck)
{
    //
    //  If the passed value is really a surrogate embedded together, then
    //  we need to break it out into its two chars. Else just one. While
    //  we are ate it, convert them to UChar format if required.
    //
    UChar           srcBuf[2];
    unsigned int    srcCount = 1;
    if (toCheck & 0xFFFF0000)
    {
        srcBuf[0] = UChar((toCheck >> 10) + 0xD800);
        srcBuf[1] = UChar(toCheck & 0x3FF) + 0xDC00;
        srcCount++;
    }
    else
    {
        srcBuf[0] = UChar(toCheck);
    }

    //
    //  Set the callback so that it will fail instead of using the rep char.
    //  Remember the old one so we can put it back.
    //
     UErrorCode  err = U_ZERO_ERROR;
     UConverterFromUCallback oldCB = NULL;
     #if (U_ICU_VERSION_MAJOR_NUM < 2)
     void* orgContent;
     #else
     const void* orgContent;
     #endif

     ucnv_setFromUCallBack
         (
         fConverter
         , UCNV_FROM_U_CALLBACK_STOP
         , NULL
         , &oldCB
         , &orgContent
         , &err
         );

    // Set up a temp buffer to format into. Make it more than big enough
    char            tmpBuf[64];
    char*           startTarget = tmpBuf;
    const UChar*    startSrc = srcBuf;

    err = U_ZERO_ERROR;
    ucnv_fromUnicode
    (
        fConverter
        , &startTarget
        , startTarget + 64
        , &startSrc
        , srcBuf + srcCount
        , 0
        , false
        , &err
    );

    // Save the result before we overight the error code
    const bool res = (err == U_ZERO_ERROR);

    // Put the old handler back
    err = U_ZERO_ERROR;
    UConverterFromUCallback orgAction = NULL;

    ucnv_setFromUCallBack(fConverter, oldCB, NULL, &orgAction, &orgContent, &err);

    return res;
}